

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vars3.c
# Opt level: O0

LispPTR N_OP_assoc(LispPTR key,LispPTR list)

{
  LispPTR LVar1;
  LispPTR local_20;
  LispPTR parm;
  LispPTR cdr;
  cadr_cell cadr1;
  LispPTR list_local;
  LispPTR key_local;
  
  if (list == 0) {
    list_local = 0;
  }
  else if ((*(ushort *)((ulong)(MDStypetbl + (list >> 9)) ^ 2) & 0x7ff) == 5) {
    if ((*(ushort *)((ulong)(MDStypetbl + (list >> 9)) ^ 2) & 0x7ff) == 5) {
      _parm = cadr(list);
      do {
        local_20 = cdr;
        if (((*(ushort *)((ulong)(MDStypetbl + (parm >> 9)) ^ 2) & 0x7ff) == 5) &&
           (LVar1 = car(parm), key == LVar1)) {
          return parm;
        }
        if ((*(ushort *)((ulong)(MDStypetbl + (cdr >> 9)) ^ 2) & 0x7ff) == 5) {
          _parm = cadr(cdr);
        }
        else {
          local_20 = 0;
        }
        if (MachineState.irqend == 0) {
          MachineState.tosvalue = local_20;
          MachineState.errorexit = 1;
          return 0xfffffffe;
        }
      } while (local_20 != 0);
      list_local = 0;
    }
    else {
      MachineState.errorexit = 1;
      list_local = 0xffffffff;
      MachineState.tosvalue = list;
    }
  }
  else {
    list_local = 0;
  }
  return list_local;
}

Assistant:

LispPTR N_OP_assoc(LispPTR key, LispPTR list) {
  struct cadr_cell cadr1;
  LispPTR cdr; /* address of (cdr A-list); Lisp address */

  if (list == NIL_PTR) { return (NIL_PTR); }

  if (!Listp(list)) { return (NIL_PTR); }

  S_N_CHECKANDCADR(list, cadr1, list);

  do {
    cdr = cadr1.cdr_cell; /* the rest of A-list */
    if (Listp(cadr1.car_cell) && key == car(cadr1.car_cell)) {
      /* cons data found */
      return (cadr1.car_cell);
    }
    /* search the rest of A-list */
    if (Listp(cdr))
      cadr1 = cadr(cdr);
    else
      cdr = NIL;
    /* check for interrupts and punt to handle one safely */
    if (!Irq_Stk_End) {
      TopOfStack = cdr; /* for next execution */
      TIMER_EXIT(cdr);
    }
  } while (cdr != NIL_PTR);

  return (NIL_PTR);
}